

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O1

address __thiscall
pstore::index::details::linear_node::flush(linear_node *this,transaction_base *transaction)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  pair<std::shared_ptr<void>,_pstore::address> local_38;
  
  transaction_base::alloc_rw(&local_38,transaction,this->size_ * 8 + 0x10,8);
  this_01._M_pi =
       local_38.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_00 = local_38.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  if ((linear_node *)this_00 != (linear_node *)0x0) {
    linear_node((linear_node *)this_00,this);
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  return (address)local_38.second.a_;
}

Assistant:

address linear_node::flush (transaction_base & transaction) const {
                std::size_t const num_bytes = this->size_bytes ();

                std::shared_ptr<void> ptr;
                address result;
                std::tie (ptr, result) = transaction.alloc_rw (num_bytes, alignof (linear_node));
                new (ptr.get ()) linear_node (*this);
                return result;
            }